

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::TZGNCore::formatGenericNonLocationName
          (TZGNCore *this,TimeZone *tz,UTimeZoneGenericNameType type,UDate date,UnicodeString *name)

{
  char cVar1;
  int8_t iVar2;
  UBool UVar3;
  int iVar4;
  int32_t iVar5;
  undefined4 extraout_var;
  long lVar7;
  TimeZoneRule *pTVar8;
  TimeZone *pTVar9;
  undefined8 uVar10;
  uint uVar11;
  bool bVar12;
  UDate UVar13;
  int32_t sav;
  UErrorCode status;
  int32_t raw;
  int32_t sav1;
  int32_t raw1;
  TimeZoneTransition after;
  UnicodeString mzGenericName;
  UnicodeString mzID;
  UnicodeString tzID;
  TimeZoneTransition before;
  UChar mzIDBuf [32];
  UChar tmpNameBuf [128];
  int local_3b0;
  int local_3ac;
  UDate local_3a8;
  int local_39c;
  int local_398;
  int local_394;
  ConstChar16Ptr local_390;
  UChar *local_388;
  UnicodeString local_378;
  UnicodeString local_338;
  UnicodeString local_2f8;
  UnicodeString local_2b8;
  UnicodeString local_278 [4];
  UChar local_178 [32];
  UChar local_138 [132];
  long *plVar6;
  
  local_3a8 = date;
  UnicodeString::setToBogus(name);
  local_390.p_ = ZoneMeta::getCanonicalCLDRID(tz);
  if (local_390.p_ == (UChar *)0x0) {
    return name;
  }
  UnicodeString::UnicodeString(&local_2b8,'\x01',&local_390,-1);
  local_388 = local_390.p_;
  uVar11 = 8;
  if (type == UTZGNM_LONG) {
    uVar11 = 1;
  }
  (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[10])
            (this->fTimeZoneNames,&local_2b8,(ulong)uVar11,name);
  if (0x1f < (ushort)(name->fUnion).fStackFields.fLengthAndFlags) goto LAB_00211d5d;
  UnicodeString::UnicodeString(&local_2f8,local_178,0,0x20);
  (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[7])
            (local_3a8,this->fTimeZoneNames,&local_2b8,&local_2f8);
  if (0x1f < (ushort)local_2f8.fUnion.fStackFields.fLengthAndFlags) {
    local_3ac = 0;
    (*(tz->super_UObject)._vptr_UObject[6])(local_3a8,tz,0,&local_39c,&local_3b0);
    if (local_3ac < 1) {
      if (local_3b0 == 0) {
        iVar4 = (*(tz->super_UObject)._vptr_UObject[0xc])(tz);
        plVar6 = (long *)CONCAT44(extraout_var,iVar4);
        if ((plVar6 == (long *)0x0) ||
           ((((lVar7 = __dynamic_cast(plVar6,&TimeZone::typeinfo,&OlsonTimeZone::typeinfo,0),
              lVar7 == 0 &&
              (lVar7 = __dynamic_cast(plVar6,&TimeZone::typeinfo,&SimpleTimeZone::typeinfo,0),
              lVar7 == 0)) &&
             (lVar7 = __dynamic_cast(plVar6,&TimeZone::typeinfo,&RuleBasedTimeZone::typeinfo,0),
             lVar7 == 0)) &&
            (lVar7 = __dynamic_cast(plVar6,&TimeZone::typeinfo,&VTimeZone::typeinfo,0), lVar7 == 0))
           )) {
          (**(code **)(*plVar6 + 0x30))
                    (local_3a8 + -15897600000.0,plVar6,0,&local_39c,&local_3b0,&local_3ac);
          if (local_3b0 == 0) {
            (**(code **)(*plVar6 + 0x30))
                      (local_3a8 + 15897600000.0,plVar6,0,&local_39c,&local_3b0,&local_3ac);
            bVar12 = local_3b0 == 0;
          }
          else {
            bVar12 = false;
          }
          if (0 < local_3ac) {
            (**(code **)(*plVar6 + 8))(plVar6);
            goto LAB_00211d50;
          }
        }
        else {
          TimeZoneTransition::TimeZoneTransition((TimeZoneTransition *)local_278);
          cVar1 = (**(code **)(*plVar6 + 0x78))(local_3a8,plVar6,1,local_278);
          if ((cVar1 == '\0') ||
             (UVar13 = TimeZoneTransition::getTime((TimeZoneTransition *)local_278),
             15897600000.0 <= local_3a8 - UVar13)) {
LAB_00211a86:
            TimeZoneTransition::TimeZoneTransition((TimeZoneTransition *)&local_378);
            cVar1 = (**(code **)(*plVar6 + 0x70))(local_3a8,plVar6,0,&local_378);
            bVar12 = true;
            if ((cVar1 != '\0') &&
               (UVar13 = TimeZoneTransition::getTime((TimeZoneTransition *)&local_378),
               UVar13 - local_3a8 < 15897600000.0)) {
              pTVar8 = TimeZoneTransition::getTo((TimeZoneTransition *)&local_378);
              iVar5 = TimeZoneRule::getDSTSavings(pTVar8);
              bVar12 = iVar5 == 0;
            }
            TimeZoneTransition::~TimeZoneTransition((TimeZoneTransition *)&local_378);
          }
          else {
            pTVar8 = TimeZoneTransition::getFrom((TimeZoneTransition *)local_278);
            iVar5 = TimeZoneRule::getDSTSavings(pTVar8);
            if (iVar5 == 0) goto LAB_00211a86;
            bVar12 = false;
          }
          TimeZoneTransition::~TimeZoneTransition((TimeZoneTransition *)local_278);
        }
        (**(code **)(*plVar6 + 8))(plVar6);
        if (bVar12) {
          UnicodeString::UnicodeString(&local_378,local_138,0,0x80);
          uVar10 = 0x10;
          if (type == UTZGNM_LONG) {
            uVar10 = 2;
          }
          (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[0xc])
                    (local_3a8,this->fTimeZoneNames,&local_2b8,uVar10,&local_378);
          if (0x1f < (ushort)local_378.fUnion.fStackFields.fLengthAndFlags) {
            UnicodeString::copyFrom(name,&local_378,'\0');
            UnicodeString::UnicodeString(&local_338,(UChar *)local_278,0,0x80);
            (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[9])
                      (this->fTimeZoneNames,&local_2f8,(ulong)uVar11,&local_338);
            iVar2 = UnicodeString::caseCompare(&local_378,&local_338,0);
            if (iVar2 == '\0') {
              UnicodeString::setToBogus(name);
            }
            UnicodeString::~UnicodeString(&local_338);
          }
          UnicodeString::~UnicodeString(&local_378);
        }
      }
      if ((ushort)(name->fUnion).fStackFields.fLengthAndFlags < 0x20) {
        UnicodeString::UnicodeString(local_278,local_138,0,0x80);
        (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[9])
                  (this->fTimeZoneNames,&local_2f8,(ulong)uVar11,local_278);
        if (0x1f < (ushort)local_278[0].fUnion._0_2_) {
          UnicodeString::UnicodeString(&local_338,(UChar *)&local_378,0,0x20);
          (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[8])
                    (this->fTimeZoneNames,&local_2f8,this->fTargetRegion,&local_338);
          if (((ushort)local_338.fUnion.fStackFields.fLengthAndFlags < 0x20) ||
             (UVar3 = UnicodeString::operator!=(&local_338,&local_2b8), UVar3 == '\0')) {
            UnicodeString::copyFrom(name,local_278,'\0');
          }
          else {
            pTVar9 = TimeZone::createTimeZone(&local_338);
            (*(pTVar9->super_UObject)._vptr_UObject[6])
                      ((double)local_3b0 + (double)local_39c + local_3a8,pTVar9,1,&local_394,
                       &local_398,&local_3ac);
            (*(pTVar9->super_UObject)._vptr_UObject[1])(pTVar9);
            if (local_3ac < 1) {
              if ((local_39c == local_394) && (local_3b0 == local_398)) {
                UnicodeString::copyFrom(name,local_278,'\0');
              }
              else {
                getPartialLocationName
                          (this,&local_2b8,&local_2f8,type == UTZGNM_LONG,local_278,name);
              }
            }
          }
          UnicodeString::~UnicodeString(&local_338);
        }
        UnicodeString::~UnicodeString(local_278);
      }
    }
  }
LAB_00211d50:
  UnicodeString::~UnicodeString(&local_2f8);
LAB_00211d5d:
  UnicodeString::~UnicodeString(&local_2b8);
  return name;
}

Assistant:

UnicodeString&
TZGNCore::formatGenericNonLocationName(const TimeZone& tz, UTimeZoneGenericNameType type, UDate date, UnicodeString& name) const {
    U_ASSERT(type == UTZGNM_LONG || type == UTZGNM_SHORT);
    name.setToBogus();

    const UChar* uID = ZoneMeta::getCanonicalCLDRID(tz);
    if (uID == NULL) {
        return name;
    }

    UnicodeString tzID(TRUE, uID, -1);

    // Try to get a name from time zone first
    UTimeZoneNameType nameType = (type == UTZGNM_LONG) ? UTZNM_LONG_GENERIC : UTZNM_SHORT_GENERIC;
    fTimeZoneNames->getTimeZoneDisplayName(tzID, nameType, name);

    if (!name.isEmpty()) {
        return name;
    }

    // Try meta zone
    UChar mzIDBuf[32];
    UnicodeString mzID(mzIDBuf, 0, UPRV_LENGTHOF(mzIDBuf));
    fTimeZoneNames->getMetaZoneID(tzID, date, mzID);
    if (!mzID.isEmpty()) {
        UErrorCode status = U_ZERO_ERROR;
        UBool useStandard = FALSE;
        int32_t raw, sav;
        UChar tmpNameBuf[ZONE_NAME_U16_MAX];

        tz.getOffset(date, FALSE, raw, sav, status);
        if (U_FAILURE(status)) {
            return name;
        }

        if (sav == 0) {
            useStandard = TRUE;

            TimeZone *tmptz = tz.clone();
            // Check if the zone actually uses daylight saving time around the time
            BasicTimeZone *btz = NULL;
            if (dynamic_cast<OlsonTimeZone *>(tmptz) != NULL
                || dynamic_cast<SimpleTimeZone *>(tmptz) != NULL
                || dynamic_cast<RuleBasedTimeZone *>(tmptz) != NULL
                || dynamic_cast<VTimeZone *>(tmptz) != NULL) {
                btz = (BasicTimeZone*)tmptz;
            }

            if (btz != NULL) {
                TimeZoneTransition before;
                UBool beforTrs = btz->getPreviousTransition(date, TRUE, before);
                if (beforTrs
                        && (date - before.getTime() < kDstCheckRange)
                        && before.getFrom()->getDSTSavings() != 0) {
                    useStandard = FALSE;
                } else {
                    TimeZoneTransition after;
                    UBool afterTrs = btz->getNextTransition(date, FALSE, after);
                    if (afterTrs
                            && (after.getTime() - date < kDstCheckRange)
                            && after.getTo()->getDSTSavings() != 0) {
                        useStandard = FALSE;
                    }
                }
            } else {
                // If not BasicTimeZone... only if the instance is not an ICU's implementation.
                // We may get a wrong answer in edge case, but it should practically work OK.
                tmptz->getOffset(date - kDstCheckRange, FALSE, raw, sav, status);
                if (sav != 0) {
                    useStandard = FALSE;
                } else {
                    tmptz->getOffset(date + kDstCheckRange, FALSE, raw, sav, status);
                    if (sav != 0){
                        useStandard = FALSE;
                    }
                }
                if (U_FAILURE(status)) {
                    delete tmptz;
                    return name;
                }
            }
            delete tmptz;
        }
        if (useStandard) {
            UTimeZoneNameType stdNameType = (nameType == UTZNM_LONG_GENERIC)
                ? UTZNM_LONG_STANDARD : UTZNM_SHORT_STANDARD;
            UnicodeString stdName(tmpNameBuf, 0, UPRV_LENGTHOF(tmpNameBuf));
            fTimeZoneNames->getDisplayName(tzID, stdNameType, date, stdName);
            if (!stdName.isEmpty()) {
                name.setTo(stdName);

                // TODO: revisit this issue later
                // In CLDR, a same display name is used for both generic and standard
                // for some meta zones in some locales.  This looks like a data bugs.
                // For now, we check if the standard name is different from its generic
                // name below.
                UChar genNameBuf[ZONE_NAME_U16_MAX];
                UnicodeString mzGenericName(genNameBuf, 0, UPRV_LENGTHOF(genNameBuf));
                fTimeZoneNames->getMetaZoneDisplayName(mzID, nameType, mzGenericName);
                if (stdName.caseCompare(mzGenericName, 0) == 0) {
                    name.setToBogus();
                }
            }
        }
        if (name.isEmpty()) {
            // Get a name from meta zone
            UnicodeString mzName(tmpNameBuf, 0, UPRV_LENGTHOF(tmpNameBuf));
            fTimeZoneNames->getMetaZoneDisplayName(mzID, nameType, mzName);
            if (!mzName.isEmpty()) {
                // Check if we need to use a partial location format.
                // This check is done by comparing offset with the meta zone's
                // golden zone at the given date.
                UChar idBuf[32];
                UnicodeString goldenID(idBuf, 0, UPRV_LENGTHOF(idBuf));
                fTimeZoneNames->getReferenceZoneID(mzID, fTargetRegion, goldenID);
                if (!goldenID.isEmpty() && goldenID != tzID) {
                    TimeZone *goldenZone = TimeZone::createTimeZone(goldenID);
                    int32_t raw1, sav1;

                    // Check offset in the golden zone with wall time.
                    // With getOffset(date, false, offsets1),
                    // you may get incorrect results because of time overlap at DST->STD
                    // transition.
                    goldenZone->getOffset(date + raw + sav, TRUE, raw1, sav1, status);
                    delete goldenZone;
                    if (U_SUCCESS(status)) {
                        if (raw != raw1 || sav != sav1) {
                            // Now we need to use a partial location format
                            getPartialLocationName(tzID, mzID, (nameType == UTZNM_LONG_GENERIC), mzName, name);
                        } else {
                            name.setTo(mzName);
                        }
                    }
                } else {
                    name.setTo(mzName);
                }
            }
        }
    }
    return name;
}